

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_rbtree.c
# Opt level: O0

RBTNode * rbt_find(RBTree *rbt,RBTNode *data)

{
  int iVar1;
  RBTNode *pRStack_28;
  int cmp;
  RBTNode *node;
  RBTNode *data_local;
  RBTree *rbt_local;
  
  pRStack_28 = rbt->root;
  while( true ) {
    if (pRStack_28 == &g_sentinel) {
      return (RBTNode *)0x0;
    }
    iVar1 = (*rbt->comparator)(data,pRStack_28,rbt->comparator_arg);
    if (iVar1 == 0) break;
    if (iVar1 < 0) {
      pRStack_28 = pRStack_28->left;
    }
    else {
      pRStack_28 = pRStack_28->right;
    }
  }
  return pRStack_28;
}

Assistant:

RBTNode *
rbt_find(RBTree *rbt, const RBTNode *data)
{
    RBTNode    *node = rbt->root;

    while (node != RBTNIL)
    {
        int         cmp = rbt->comparator(data, node, rbt->comparator_arg);

        if (cmp == 0)
            return node;
        else if (cmp < 0)
            node = node->left;
        else
            node = node->right;
    }

    return NULL;
}